

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O0

int ParseFile_CdnConfig(TCascStorage *hs,void *pvListFile)

{
  bool bVar1;
  size_t sVar2;
  char *pcStack_30;
  int nError;
  char *szLineEnd;
  char *szLineBegin;
  void *pvListFile_local;
  TCascStorage *hs_local;
  
  szLineBegin = (char *)pvListFile;
  pvListFile_local = hs;
  while (sVar2 = ListFile_GetNextLine(szLineBegin,&szLineEnd,&stack0xffffffffffffffd0), sVar2 != 0)
  {
    bVar1 = CheckConfigFileVariable
                      ((TCascStorage *)pvListFile_local,szLineEnd,pcStack_30,"archive-group",
                       LoadQueryKey,(void *)((long)pvListFile_local + 0x68));
    if ((((!bVar1) &&
         (bVar1 = CheckConfigFileVariable
                            ((TCascStorage *)pvListFile_local,szLineEnd,pcStack_30,"archives",
                             LoadQueryKey,(void *)((long)pvListFile_local + 0x78)), !bVar1)) &&
        (bVar1 = CheckConfigFileVariable
                           ((TCascStorage *)pvListFile_local,szLineEnd,pcStack_30,"patch-archives",
                            LoadQueryKey,(void *)((long)pvListFile_local + 0x88)), !bVar1)) &&
       (bVar1 = CheckConfigFileVariable
                          ((TCascStorage *)pvListFile_local,szLineEnd,pcStack_30,
                           "patch-archive-group",LoadQueryKey,
                           (void *)((long)pvListFile_local + 0x98)), !bVar1)) {
      CheckConfigFileVariable
                ((TCascStorage *)pvListFile_local,szLineEnd,pcStack_30,"builds",LoadQueryKey,
                 (void *)((long)pvListFile_local + 0xa8));
    }
  }
  if ((*(long *)((long)pvListFile_local + 0x78) == 0) ||
     (*(long *)((long)pvListFile_local + 0x80) == 0)) {
    hs_local._4_4_ = 1000;
  }
  else {
    hs_local._4_4_ = 0;
  }
  return hs_local._4_4_;
}

Assistant:

static int ParseFile_CdnConfig(TCascStorage * hs, void * pvListFile)
{
    const char * szLineBegin;
    const char * szLineEnd;
    int nError = ERROR_SUCCESS;

    // Keep parsing the listfile while there is something in there
    for(;;)
    {
        // Get the next line
        if(!ListFile_GetNextLine(pvListFile, &szLineBegin, &szLineEnd))
            break;

        // CDN key of ARCHIVE-GROUP. Archive-group is actually a very special '.index' file.
        // It is essentially a merger of all .index files, with a structure change
        // When ".index" added after the ARCHIVE-GROUP, we get file name in "indices" folder
        if(CheckConfigFileVariable(hs, szLineBegin, szLineEnd, "archive-group", LoadQueryKey, &hs->ArchiveGroup))
            continue;

        // CDN key of all archives. When ".index" added to the string, we get file name in "indices" folder
        if(CheckConfigFileVariable(hs, szLineBegin, szLineEnd, "archives", LoadQueryKey, &hs->ArchivesKey))
            continue;

        // CDN keys of patch archives (needs research) 
        if(CheckConfigFileVariable(hs, szLineBegin, szLineEnd, "patch-archives", LoadQueryKey, &hs->PatchArchivesKey))
            continue;

        // CDN key of probably the combined patch index file (needs research)
        if(CheckConfigFileVariable(hs, szLineBegin, szLineEnd, "patch-archive-group", LoadQueryKey, &hs->PatchArchivesGroup))
            continue;

        // List of build configs this config supports (optional)
        // Points to file: "data\config\%02X\%02X\%s
        if(CheckConfigFileVariable(hs, szLineBegin, szLineEnd, "builds", LoadQueryKey, &hs->BuildFiles))
            continue;
    }

    // Check if all required fields are present
    if(hs->ArchivesKey.pbData == NULL || hs->ArchivesKey.cbData == 0)
        return ERROR_BAD_FORMAT;

    return nError;
}